

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.h
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmResourceInfoCommon::IsResourceMappedCompressible(GmmResourceInfoCommon *this)

{
  int iVar1;
  undefined4 extraout_var;
  SKU_FEATURE_TABLE *pSVar2;
  bool local_21;
  uint local_14;
  uint32_t CompressedRes;
  GmmResourceInfoCommon *this_local;
  
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  pSVar2 = Context::GetSkuTable((Context *)CONCAT44(extraout_var,iVar1));
  if (((ulong)pSVar2->field_1 >> 0x22 & 1) == 0) {
    local_21 = true;
    if (((ulong)(this->Surf).Flags.Info >> 0x1d & 1) == 0) {
      local_21 = ((ulong)(this->Surf).Flags.Info >> 0x14 & 1) != 0;
    }
  }
  else {
    local_21 = (bool)((((ulong)(this->Surf).Flags.Info >> 0x2d & 1) != 0 ^ 0xffU) & 1);
  }
  local_14 = (uint)local_21;
  return local_14;
}

Assistant:

GMM_INLINE_VIRTUAL GMM_INLINE_EXPORTED uint32_t GMM_STDCALL IsResourceMappedCompressible()
            {
                uint32_t CompressedRes = 0;
                if (GetGmmLibContext()->GetSkuTable().FtrXe2Compression)
                {
                    CompressedRes = !Surf.Flags.Info.NotCompressed;
                }
                else
                {
                    CompressedRes = Surf.Flags.Info.RenderCompressed || Surf.Flags.Info.MediaCompressed;
                }

                return CompressedRes;
            }